

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_ghosts(Integer g_a,Integer *width)

{
  global_array_t *pgVar1;
  global_array_t *pgVar2;
  long lVar3;
  long lVar4;
  long icode;
  
  lVar4 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set ghost widths on array that has been allocated",0);
  }
  if (GA[lVar4].ndim < 1) {
    pnga_error("Dimensions must be set before array widths are specified",0);
  }
  lVar3 = (long)GA[lVar4].ndim;
  if (0 < lVar3) {
    icode = 0;
    do {
      if (GA[g_a + 1000].dims[icode] < width[icode]) {
        pnga_error("Boundary width must be <= corresponding dimension",icode);
      }
      if (width[icode] < 0) {
        pnga_error("Boundary width must be >= 0",icode);
      }
      icode = icode + 1;
      lVar3 = (long)GA[lVar4].ndim;
    } while (icode < lVar3);
  }
  pgVar2 = GA;
  if (0 < lVar3) {
    pgVar1 = GA + lVar4;
    lVar4 = 0;
    do {
      pgVar2[g_a + 1000].width[lVar4] = width[lVar4];
      if (0 < width[lVar4]) {
        pgVar1->ghosts = 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void pnga_set_ghosts(Integer g_a, Integer *width)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set ghost widths on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before array widths are specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++) {
    if ((C_Integer)width[i] > GA[ga_handle].dims[i])
      pnga_error("Boundary width must be <= corresponding dimension",i);
    if ((C_Integer)width[i] < 0)
      pnga_error("Boundary width must be >= 0",i);
  }
  for (i=0; i<GA[ga_handle].ndim; i++) {
    GA[ga_handle].width[i] = (C_Integer)width[i];
    if (width[i] > 0) GA[ga_handle].ghosts = 1;
  }
}